

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O1

unsigned_long __thiscall ByteString::long_val(ByteString *this)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  puVar1 = (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->byteString).
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (uVar2 != 0) {
    uVar3 = 8;
    if (uVar2 < 8) {
      uVar3 = uVar2;
    }
    lVar4 = 0;
    uVar2 = 0;
    do {
      uVar2 = (ulong)puVar1[lVar4] | uVar2 << 8;
      lVar4 = lVar4 + 1;
    } while (uVar3 + (uVar3 == 0) != lVar4);
    return uVar2;
  }
  return 0;
}

Assistant:

unsigned long ByteString::long_val() const
{
	// Convert the first 8 bytes of the string to an unsigned long value
	unsigned long rv = 0;

	for (size_t i = 0; i < std::min(size_t(8), byteString.size()); i++)
	{
		rv <<= 8;
		rv += byteString[i];
	}

	return rv;
}